

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWbool isValidElementForJoystick(_GLFWmapelement *e,_GLFWjoystick *js)

{
  _GLFWjoystick *js_local;
  _GLFWmapelement *e_local;
  
  if ((e->type == '\x03') && (js->hatCount <= (int)(uint)e->value >> 4)) {
    e_local._4_4_ = 0;
  }
  else if ((e->type == '\x02') && (js->buttonCount <= (int)(uint)e->value)) {
    e_local._4_4_ = 0;
  }
  else if ((e->type == '\x01') && (js->axisCount <= (int)(uint)e->value)) {
    e_local._4_4_ = 0;
  }
  else {
    e_local._4_4_ = 1;
  }
  return e_local._4_4_;
}

Assistant:

static GLFWbool isValidElementForJoystick(const _GLFWmapelement* e,
                                          const _GLFWjoystick* js)
{
    if (e->type == _GLFW_JOYSTICK_HATBIT && (e->value >> 4) >= js->hatCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_BUTTON && e->value >= js->buttonCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_AXIS && e->value >= js->axisCount)
        return GLFW_FALSE;

    return GLFW_TRUE;
}